

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

completion * __thiscall
mjs::interpreter::impl::operator()(completion *__return_storage_ptr__,impl *this,try_statement *s)

{
  gc_heap *h;
  bool bVar1;
  block_statement *s_00;
  object *poVar2;
  wstring *this_00;
  completion *local_198;
  undefined1 local_148 [8];
  completion fc;
  block_statement *finally_;
  undefined1 local_c0 [8];
  auto_scope catch_scope;
  string local_98 [2];
  undefined1 local_78 [8];
  object_ptr o;
  block_statement *catch_;
  completion c;
  try_statement *s_local;
  impl *this_local;
  
  c.target._M_str = (wchar_t *)s;
  s_00 = try_statement::block(s);
  eval((completion *)&catch_,this,&s_00->super_statement);
  if (((int)catch_ == 4) &&
     (o.super_gc_heap_ptr_untyped._8_8_ =
           try_statement::catch_block((try_statement *)c.target._M_str),
     (block_statement *)o.super_gc_heap_ptr_untyped._8_8_ != (block_statement *)0x0)) {
    gc_heap_ptr<mjs::global_object>::operator->(&this->global_);
    global_object::make_object((global_object *)local_78);
    poVar2 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_78);
    h = this->heap_;
    this_00 = try_statement::catch_id_abi_cxx11_((try_statement *)c.target._M_str);
    catch_scope.old_scopes.super_gc_heap_ptr_untyped._8_8_ =
         std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)this_00);
    string::string(local_98,h,(wstring_view *)&catch_scope.old_scopes.super_gc_heap_ptr_untyped.pos_
                  );
    (*poVar2->_vptr_object[1])(poVar2,local_98,&c,4);
    string::~string(local_98);
    auto_scope::auto_scope((auto_scope *)local_c0,this,(object_ptr *)local_78,&this->active_scope_);
    eval((completion *)&finally_,this,(statement *)o.super_gc_heap_ptr_untyped._8_8_);
    completion::operator=((completion *)&catch_,(completion *)&finally_);
    completion::~completion((completion *)&finally_);
    auto_scope::~auto_scope((auto_scope *)local_c0);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_78);
  }
  fc.target._M_str = (wchar_t *)try_statement::finally_block((try_statement *)c.target._M_str);
  if ((block_statement *)fc.target._M_str == (block_statement *)0x0) {
    completion::completion(__return_storage_ptr__,(completion *)&catch_);
  }
  else {
    eval((completion *)local_148,this,(statement *)fc.target._M_str);
    bVar1 = completion::operator_cast_to_bool((completion *)local_148);
    if (bVar1) {
      local_198 = (completion *)local_148;
    }
    else {
      local_198 = (completion *)&catch_;
    }
    completion::completion(__return_storage_ptr__,local_198);
    completion::~completion((completion *)local_148);
  }
  completion::~completion((completion *)&catch_);
  return __return_storage_ptr__;
}

Assistant:

completion operator()(const try_statement& s) {
        auto c = eval(s.block());
        if (c.type != completion_type::throw_) {
            // Nothing to do
        } else if (auto catch_ = s.catch_block()) {
            auto o = global_->make_object();
            o->put(string{heap_, s.catch_id()}, c.result, property_attribute::dont_delete);
            auto_scope catch_scope{*this, o, active_scope_};
            c = eval(*catch_);
        }
        if (auto finally_ = s.finally_block()) {
            auto fc = eval(*finally_);
            return fc ? fc : c;
        }
        return c;
    }